

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::~WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this)

{
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  string_view in_stack_ffffffffffffffe8;
  
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  log::debug<>::debug((debug<> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                      (srcLoc *)&PTR_s__workspace_llm4binary_github_lic_001761d8);
  http::std::function<void_(webfront::websocket::CloseEvent)>::~function
            ((function<void_(webfront::websocket::CloseEvent)> *)0x11046c);
  http::std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>::~function
            ((function<void_(std::span<const_std::byte,_18446744073709551615UL>)> *)0x11047d);
  http::std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)0x11048e);
  FrameDecoder::~FrameDecoder((FrameDecoder *)0x11049f);
  http::std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>::
  ~basic_stream_socket((basic_stream_socket<std::experimental::net::v1::ip::tcp> *)0x1104a9);
  return;
}

Assistant:

~WebSocket() { log::debug("WebSocket destructor"); }